

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O3

void tcu::astc::anon_unknown_0::encodeISE
               (BitAssignAccessStream *dst,ISEParams *params,ISEInput *input,int numValues)

{
  undefined8 *puVar1;
  bool bVar2;
  deUint32 dVar3;
  uint uVar4;
  uint uVar5;
  anon_union_1536_2_f6fb8abe_for_value *paVar6;
  uint uVar7;
  uint *puVar8;
  ulong uVar9;
  ISEInput *pIVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  anon_union_1536_2_f6fb8abe_for_value *paVar14;
  deUint32 bitParts [3];
  deUint32 quintParts [3];
  deUint32 local_a8 [8];
  uint local_88 [8];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  ISEParams *local_38;
  
  local_38 = params;
  if (params->mode == ISEMODE_TRIT) {
    uVar4 = (uint)(0x33333332 < numValues * -0x33333333 + 0x19999999U);
    uVar5 = uVar4 + numValues / 5;
    if (uVar5 != 0 && SCARRY4(uVar4,numValues / 5) == (int)uVar5 < 0) {
      local_40 = (ulong)(uVar5 - 1);
      local_48 = (ulong)uVar5;
      local_50 = (long)(int)(numValues + (uVar5 - 1) * -5);
      uVar9 = 0;
      do {
        bVar2 = input->isGivenInBlockForm;
        if (bVar2 == true) {
          local_58 = *(undefined8 *)((long)&input->value + uVar9 * 0x18 + 0x10);
          puVar1 = (undefined8 *)((long)&input->value + uVar9 * 0x18);
          local_68 = *puVar1;
          uStack_60 = puVar1[1];
        }
        else {
          local_68 = 0;
          uStack_60 = 0;
          local_58 = 0;
        }
        uVar5 = local_38->numBits;
        uVar4 = ~(-1 << ((byte)uVar5 & 0x1f));
        if (0x1f < uVar5) {
          uVar4 = 0xffffffff;
        }
        lVar11 = 5;
        if (uVar9 == local_40) {
          lVar11 = local_50;
        }
        lVar12 = 0;
        do {
          while( true ) {
            while (lVar11 <= lVar12) {
              local_a8[lVar12] = 0;
              local_88[lVar12] = 0;
              lVar12 = lVar12 + 1;
              if (lVar12 == 5) {
                puVar8 = (uint *)&local_68;
                if (bVar2 != false) goto LAB_019caa57;
                goto LAB_019caa10;
              }
            }
            if (bVar2 == false) break;
            local_a8[lVar12] = *(deUint32 *)((long)&local_68 + lVar12 * 4 + 4);
            local_88[lVar12] = 0xffffffff;
            lVar12 = lVar12 + 1;
            if (lVar12 == 5) {
              puVar8 = (uint *)&local_68;
              goto LAB_019caa57;
            }
          }
          uVar13 = *(uint *)((long)&input->value +
                            lVar12 * 4 + ((long)((uVar9 << 0x20) * 5) >> 0x1e));
          dVar3 = uVar13 & uVar4;
          if ((int)uVar5 < 1) {
            dVar3 = 0;
          }
          local_a8[lVar12] = dVar3;
          local_88[lVar12] = uVar13 >> ((byte)uVar5 & 0x1f);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 5);
LAB_019caa10:
        puVar8 = (uint *)(astc::(anonymous_namespace)::
                          encodeISETritBlock(tcu::astc::(anonymous_namespace)::BitAssignAccessStream&,int,bool,tcu::astc::(anonymous_namespace)::ISEInput::Block_const&,unsigned_int_const*,int)
                          ::tritBlockTValue +
                         (ulong)local_88[4] * 4 +
                         (ulong)local_88[3] * 0xc +
                         (ulong)local_88[2] * 0x24 +
                         (ulong)local_88[1] * 0x6c + (ulong)local_88[0] * 0x144);
LAB_019caa57:
        uVar4 = *puVar8;
        BitAssignAccessStream::setNext(dst,uVar5,local_a8[0]);
        BitAssignAccessStream::setNext(dst,2,uVar4 & 3);
        BitAssignAccessStream::setNext(dst,uVar5,local_a8[1]);
        BitAssignAccessStream::setNext(dst,2,uVar4 >> 2 & 3);
        BitAssignAccessStream::setNext(dst,uVar5,local_a8[2]);
        BitAssignAccessStream::setNext(dst,1,uVar4 >> 4 & 1);
        BitAssignAccessStream::setNext(dst,uVar5,local_a8[3]);
        BitAssignAccessStream::setNext(dst,2,uVar4 >> 5 & 3);
        BitAssignAccessStream::setNext(dst,uVar5,local_a8[4]);
        BitAssignAccessStream::setNext(dst,1,uVar4 >> 7 & 1);
        uVar9 = uVar9 + 1;
      } while (uVar9 != local_48);
    }
  }
  else if (params->mode == ISEMODE_QUINT) {
    uVar5 = (uint)(0x55555554 < numValues * -0x55555555 + 0x2aaaaaaaU);
    uVar4 = uVar5 + numValues / 3;
    if (uVar4 != 0 && SCARRY4(uVar5,numValues / 3) == (int)uVar4 < 0) {
      local_40 = (ulong)(uVar4 - 1);
      local_48 = (ulong)uVar4;
      local_50 = (long)(int)(numValues + (uVar4 - 1) * -3);
      uVar9 = 0;
      do {
        bVar2 = input->isGivenInBlockForm;
        if (bVar2 == true) {
          local_58 = *(undefined8 *)((long)&input->value + uVar9 * 0x18 + 0x10);
          puVar1 = (undefined8 *)((long)&input->value + uVar9 * 0x18);
          local_68 = *puVar1;
          uStack_60 = puVar1[1];
        }
        else {
          local_68 = 0;
          uStack_60 = 0;
          local_58 = 0;
        }
        uVar5 = local_38->numBits;
        uVar4 = ~(-1 << ((byte)uVar5 & 0x1f));
        if (0x1f < uVar5) {
          uVar4 = 0xffffffff;
        }
        lVar11 = 3;
        if (uVar9 == local_40) {
          lVar11 = local_50;
        }
        lVar12 = 0;
        do {
          if (lVar12 < lVar11) {
            if (bVar2 == false) {
              uVar13 = *(uint *)((long)&input->value +
                                lVar12 * 4 + ((long)((uVar9 << 0x20) * 3) >> 0x1e));
              uVar7 = uVar13 & uVar4;
              if ((int)uVar5 < 1) {
                uVar7 = 0;
              }
              local_a8[lVar12] = uVar7;
              uVar13 = uVar13 >> ((byte)uVar5 & 0x1f);
            }
            else {
              local_a8[lVar12] = *(deUint32 *)((long)&local_68 + lVar12 * 4 + 4);
              uVar13 = 0xffffffff;
            }
          }
          else {
            local_a8[lVar12] = 0;
            uVar13 = 0;
          }
          local_88[lVar12] = uVar13;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        puVar8 = (uint *)(astc::(anonymous_namespace)::
                          encodeISEQuintBlock(tcu::astc::(anonymous_namespace)::BitAssignAccessStream&,int,bool,tcu::astc::(anonymous_namespace)::ISEInput::Block_const&,unsigned_int_const*,int)
                          ::quintBlockQValue +
                         (ulong)local_88[2] * 4 +
                         (ulong)local_88[1] * 0x14 + (ulong)local_88[0] * 100);
        if (bVar2 != false) {
          puVar8 = (uint *)&local_68;
        }
        uVar4 = *puVar8;
        BitAssignAccessStream::setNext(dst,uVar5,local_a8[0]);
        BitAssignAccessStream::setNext(dst,3,uVar4 & 7);
        BitAssignAccessStream::setNext(dst,uVar5,local_a8[1]);
        BitAssignAccessStream::setNext(dst,2,uVar4 >> 3 & 3);
        BitAssignAccessStream::setNext(dst,uVar5,local_a8[2]);
        BitAssignAccessStream::setNext(dst,2,uVar4 >> 5 & 3);
        uVar9 = uVar9 + 1;
      } while (uVar9 != local_48);
    }
  }
  else if (0 < numValues) {
    uVar9 = (ulong)(uint)numValues;
    paVar14 = (anon_union_1536_2_f6fb8abe_for_value *)((input->value).plain + 1);
    pIVar10 = input;
    do {
      pIVar10 = (ISEInput *)&pIVar10->value;
      paVar6 = (anon_union_1536_2_f6fb8abe_for_value *)pIVar10;
      if (input->isGivenInBlockForm != false) {
        paVar6 = paVar14;
      }
      BitAssignAccessStream::setNext(dst,local_38->numBits,paVar6->plain[0]);
      paVar14 = (anon_union_1536_2_f6fb8abe_for_value *)(paVar14->plain + 6);
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  return;
}

Assistant:

static void encodeISE (BitAssignAccessStream& dst, const ISEParams& params, const ISEInput& input, int numValues)
{
	if (params.mode == ISEMODE_TRIT)
	{
		const int numBlocks = deDivRoundUp32(numValues, 5);
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			const int numValuesInBlock = blockNdx == numBlocks-1 ? numValues - 5*(numBlocks-1) : 5;
			encodeISETritBlock(dst, params.numBits, input.isGivenInBlockForm,
							   input.isGivenInBlockForm ? input.value.block[blockNdx]	: ISEInput::Block(),
							   input.isGivenInBlockForm ? DE_NULL						: &input.value.plain[5*blockNdx],
							   numValuesInBlock);
		}
	}
	else if (params.mode == ISEMODE_QUINT)
	{
		const int numBlocks = deDivRoundUp32(numValues, 3);
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			const int numValuesInBlock = blockNdx == numBlocks-1 ? numValues - 3*(numBlocks-1) : 3;
			encodeISEQuintBlock(dst, params.numBits, input.isGivenInBlockForm,
								input.isGivenInBlockForm ? input.value.block[blockNdx]	: ISEInput::Block(),
								input.isGivenInBlockForm ? DE_NULL						: &input.value.plain[3*blockNdx],
								numValuesInBlock);
		}
	}
	else
	{
		DE_ASSERT(params.mode == ISEMODE_PLAIN_BIT);
		for (int i = 0; i < numValues; i++)
			encodeISEBitBlock(dst, params.numBits, input.isGivenInBlockForm ? input.value.block[i].bitValues[0] : input.value.plain[i]);
	}
}